

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

void isofile_free_all_entries(iso9660_conflict *iso9660)

{
  isofile *piVar1;
  long in_RDI;
  isofile *file_next;
  isofile *file;
  isofile *file_00;
  
  file_00 = *(isofile **)(in_RDI + 0x88);
  while (file_00 != (isofile *)0x0) {
    piVar1 = file_00->allnext;
    isofile_free(file_00);
    file_00 = piVar1;
  }
  return;
}

Assistant:

static void
isofile_free_all_entries(struct iso9660 *iso9660)
{
	struct isofile *file, *file_next;

	file = iso9660->all_file_list.first;
	while (file != NULL) {
		file_next = file->allnext;
		isofile_free(file);
		file = file_next;
	}
}